

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

table_arrays<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>_>
* boost::unordered::detail::foa::
  table_arrays<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>_>
  ::new_(table_arrays<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>_>
         *param_1,
        allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
        *param_2,undefined8 param_3)

{
  table_arrays<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>_>
  *arrays;
  size_t groups_size;
  size_t groups_size_index;
  table_arrays<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>_>
  *__a;
  allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
  local_21;
  size_t local_20;
  size_t local_18;
  undefined8 local_10;
  allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
  *local_8;
  
  __a = param_1;
  local_10 = param_3;
  local_8 = param_2;
  local_18 = foa::
             size_index_for<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy>
                       (0x270996);
  local_20 = pow2_size_policy::size(local_18);
  table_arrays(param_1,local_18,local_20 - 1,(group_type_pointer)0x0,(value_type_pointer)0x0);
  std::
  allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
  ::allocator(param_2,(allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
                       *)__a);
  set_arrays(param_1,&local_21,local_10);
  std::
  allocator<std::pair<const_slang::driver::SourceLoader::UnitEntry_*const,_std::vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>_>_>
  ::~allocator(&local_21);
  return __a;
}

Assistant:

static table_arrays new_(allocator_type al, std::size_t n) {
        auto groups_size_index = size_index_for<group_type, size_policy>(n);
        auto groups_size = size_policy::size(groups_size_index);
        table_arrays arrays{groups_size_index, groups_size - 1, nullptr, nullptr};

        set_arrays(arrays, al, n);
        return arrays;
    }